

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O3

err_t bpkiShareWrap(octet *epki,size_t *epki_len,octet *share,size_t share_len,octet *pwd,
                   size_t pwd_len,octet *salt,size_t iter)

{
  bool_t bVar1;
  err_t eVar2;
  err_t eVar3;
  size_t sVar4;
  octet *poVar5;
  size_t count;
  size_t local_58;
  
  if (9999 < iter) {
    if (0x21 < share_len) {
      return 0x1f7;
    }
    if ((0x202020000U >> (share_len & 0x3f) & 1) == 0) {
      return 0x1f7;
    }
    if (share == (octet *)0x0) {
      poVar5 = (octet *)0x0;
    }
    else {
      bVar1 = memIsValid(share,1);
      if (bVar1 == 0) {
        return 0x1f7;
      }
      poVar5 = share;
      if ((byte)(*share - 0x11) < 0xf0) {
        return 0x1f7;
      }
    }
    sVar4 = bpkiShareEnc((octet *)0x0,poVar5,share_len);
    if (sVar4 == 0xffffffffffffffff) {
      return 0x132;
    }
    local_58 = bpkiEdataEnc((octet *)0x0,(octet *)0x0,sVar4 + 0x10,(octet *)0x0,iter);
    if (local_58 == 0xffffffffffffffff) {
      return 0x132;
    }
    if (epki_len != (size_t *)0x0) {
      bVar1 = memIsValid(epki_len,8);
      if (bVar1 == 0) {
        return 0x6d;
      }
      *epki_len = local_58;
    }
    if (epki == (octet *)0x0) {
      return 0;
    }
    bVar1 = memIsValid(share,share_len);
    if (((bVar1 != 0) && (bVar1 = memIsValid(epki,local_58), bVar1 != 0)) &&
       (bVar1 = memIsValid(pwd,pwd_len), bVar1 != 0)) {
      bVar1 = memIsValid(salt,8);
      if (bVar1 == 0) {
        return 0x6d;
      }
      poVar5 = (octet *)blobCreate(0x20);
      if (poVar5 == (octet *)0x0) {
        return 0x6e;
      }
      eVar2 = beltPBKDF2(poVar5,pwd,pwd_len,iter,salt,8);
      if (eVar2 == 0) {
        count = bpkiShareEnc(epki + (local_58 - sVar4),share,share_len);
        if (count == 0xffffffffffffffff) {
          eVar3 = 0x1f8;
        }
        else {
          eVar2 = 0;
          eVar3 = beltKWPWrap(epki + (local_58 - count) + -0x10,epki + (local_58 - count),count,
                              (octet *)0x0,poVar5,0x20);
          if (eVar3 == 0) {
            sVar4 = bpkiEdataEnc(epki,epki + (local_58 - sVar4) + -0x10,sVar4 + 0x10,salt,iter);
            if (sVar4 != 0xffffffffffffffff) goto LAB_00124e42;
            local_58 = 0xffffffffffffffff;
            eVar3 = 0x132;
          }
        }
        eVar2 = eVar3;
        memWipe(epki,local_58);
      }
LAB_00124e42:
      blobClose(poVar5);
      return eVar2;
    }
  }
  return 0x6d;
}

Assistant:

err_t bpkiShareWrap(octet epki[], size_t* epki_len, const octet share[],
	size_t share_len, const octet pwd[], size_t pwd_len,
	const octet salt[8], size_t iter)
{
	size_t pki_len, edata_len, count;
	octet* key;
	err_t code;
	// проверить входные данные
	if (iter < 10000)
		return ERR_BAD_INPUT;
	if (share_len != 17 && share_len != 25 && share_len != 33 ||
		share && (!memIsValid(share, 1) || share[0] == 0 || share[0] > 16))
		return ERR_BAD_SECKEY;
	// определить длину epki
	pki_len = bpkiShareEnc(0, share, share_len);
	if (pki_len == SIZE_MAX)
		return ERR_BAD_FORMAT;
	edata_len = pki_len + 16;
	count = bpkiEdataEnc(0, 0, edata_len, 0, iter);
	if (count == SIZE_MAX)
		return ERR_BAD_FORMAT;
	if (epki_len)
	{
		if (!memIsValid(epki_len, O_PER_S))
			return ERR_BAD_INPUT;
		*epki_len = count;
	}
	if (!epki)
		return ERR_OK;
	// проверить указатели
	if (!memIsValid(share, share_len) ||
		!memIsValid(epki, count) ||
		!memIsValid(pwd, pwd_len) ||
		!memIsValid(salt, 8))
		return ERR_BAD_INPUT;
	// сгенерировать ключ
	key = (octet*)blobCreate(32);
	if (!key)
		return ERR_OUTOFMEMORY;
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(key));
	// кодировать pki
	pki_len = bpkiShareEnc(epki + count - pki_len, share, share_len);
	code = pki_len != SIZE_MAX ? ERR_OK : ERR_BAD_PRIVKEY;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// зашифровать pki
	code = beltKWPWrap(epki + count - pki_len - 16,
		epki + count - pki_len, pki_len, 0, key, 32);
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// кодировать edata и epki
	count = bpkiEdataEnc(epki, epki + count - edata_len, edata_len,
		salt, iter);
	code = count != SIZE_MAX ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// все нормально
	blobClose(key);
	return ERR_OK;
}